

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::CheckLaneIndex(WasmBytecodeGenerator *this,OpCodeAsmJs op,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  WasmCompilationException *this_00;
  int iVar6;
  undefined6 in_register_00000032;
  
  iVar6 = (int)CONCAT62(in_register_00000032,op);
  if (iVar6 < 0x1a9) {
    uVar3 = iVar6 - 0x147;
    if (uVar3 < 0x24) {
      uVar4 = 2;
      if ((0x6003UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00f360d0;
      if ((0xc00000000U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00f3604f;
    }
LAB_00f36076:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x5e0,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = iVar6 - 0x1a9;
    if (uVar3 < 0x15) {
      if ((0x183U >> (uVar3 & 0x1f) & 1) != 0) {
        uVar4 = 4;
        goto LAB_00f360d0;
      }
      if ((0x180000U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_00f36060;
    }
    else {
LAB_00f36060:
      if (1 < iVar6 - 0x20aU) {
        if (iVar6 - 0x22cU < 2) {
LAB_00f3604f:
          uVar4 = 0x10;
          goto LAB_00f360d0;
        }
        goto LAB_00f36076;
      }
    }
    uVar4 = 8;
  }
LAB_00f360d0:
  if (index < uVar4) {
    return;
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(this_00,L"index is out of range");
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmBytecodeGenerator::CheckLaneIndex(Js::OpCodeAsmJs op, const uint index)
{
    uint numLanes;
    switch (op) 
    {
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I2:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I2:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_D2:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_D2:
        numLanes = 2;
        break;
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I4:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I4:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_F4:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_F4:
        numLanes = 4;
        break;
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I8:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_U8:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I8:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_U8:
        numLanes = 8;
        break;
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I16:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_U16:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I16:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_U16:
        numLanes = 16;
        break;
    default:
        Assert(UNREACHED);
        numLanes = 0;
    }

    if (index >= numLanes)
    {
        throw WasmCompilationException(_u("index is out of range"));
    }
}